

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_json_double_nonfinite(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  char *__s1;
  char *__s2;
  char *expected;
  char *str;
  bson_t *b;
  size_t len;
  
  uVar3 = bson_new();
  bVar1 = bson_append_double(0x7ff8000000000000,uVar3,"nan",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x198,"test_bson_as_json_double_nonfinite","bson_append_double (b, \"nan\", -1, NAN)");
    abort();
  }
  bVar1 = bson_append_double(0x7ff0000000000000,uVar3,"pos_inf",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x199,"test_bson_as_json_double_nonfinite",
            "bson_append_double (b, \"pos_inf\", -1, INFINITY)");
    abort();
  }
  bVar1 = bson_append_double(0xfff0000000000000,uVar3,"neg_inf",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x19a,"test_bson_as_json_double_nonfinite",
            "bson_append_double (b, \"neg_inf\", -1, -INFINITY)");
    abort();
  }
  __s1 = (char *)bson_as_json(uVar3,&b);
  __s2 = (char *)bson_strdup_printf(0x7ff8000000000000,0x7ff0000000000000,0xfff0000000000000,
                                    "{ \"nan\" : %.20g, \"pos_inf\" : %.20g, \"neg_inf\" : %.20g }")
  ;
  if (__s1 != __s2) {
    iVar2 = strcmp(__s1,__s2);
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",__s1,__s2);
      abort();
    }
  }
  bson_free(__s2);
  bson_free(__s1);
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_bson_as_json_double_nonfinite (void)
{
   size_t len;
   bson_t *b;
   char *str;
   char *expected;

   b = bson_new ();
   BSON_ASSERT (bson_append_double (b, "nan", -1, NAN));
   BSON_ASSERT (bson_append_double (b, "pos_inf", -1, INFINITY));
   BSON_ASSERT (bson_append_double (b, "neg_inf", -1, -INFINITY));
   str = bson_as_json (b, &len);

   expected = bson_strdup_printf ("{"
                                  " \"nan\" : %.20g,"
                                  " \"pos_inf\" : %.20g,"
                                  " \"neg_inf\" : %.20g }",
                                  NAN,
                                  INFINITY,
                                  -INFINITY);

   ASSERT_CMPSTR (str, expected);

   bson_free (expected);
   bson_free (str);
   bson_destroy (b);
}